

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O2

void Wln_WriteTables(FILE *pFile,Wln_Ntk_t *p)

{
  uint uVar1;
  word *pTable;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *__s;
  int iVar4;
  long lVar5;
  
  if (p->vTables != (Vec_Ptr_t *)0x0) {
    uVar1 = p->vTables->nSize;
    if ((long)(int)uVar1 != 0) {
      p_00 = (Vec_Int_t *)malloc(0x10);
      uVar3 = 0x10;
      if (0x10 < uVar1) {
        uVar3 = uVar1;
      }
      p_00->nCap = uVar3;
      __s = (int *)malloc((long)(int)uVar3 << 2);
      p_00->pArray = __s;
      p_00->nSize = uVar1;
      if (__s != (int *)0x0) {
        memset(__s,0,(long)(int)uVar1 << 2);
      }
      iVar4 = 1;
      do {
        if ((p->vTypes).nSize <= iVar4) {
          for (lVar5 = 0; lVar5 < p->vTables->nSize; lVar5 = lVar5 + 1) {
            pTable = (word *)p->vTables->pArray[lVar5];
            iVar4 = Vec_IntEntry(p_00,(int)lVar5);
            iVar2 = Wln_ObjFanin0(p,iVar4);
            iVar2 = Wln_ObjRange(p,iVar2);
            iVar4 = Wln_ObjRange(p,iVar4);
            Wln_WriteTableOne(pFile,iVar2,iVar4,pTable,(int)lVar5);
          }
          free(__s);
          free(p_00);
          return;
        }
        iVar2 = Vec_IntEntry(&p->vTypes,iVar4);
        if (iVar2 == 0x4d) {
          uVar3 = Wln_ObjFanin1(p,iVar4);
          if (((int)uVar3 < 0) || ((int)uVar1 <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          __s[uVar3] = iVar4;
        }
        iVar4 = iVar4 + 1;
      } while( true );
    }
  }
  return;
}

Assistant:

void Wln_WriteTables( FILE * pFile, Wln_Ntk_t * p )
{
    Vec_Int_t * vNodes;
    word * pTable; 
    int i, iObj;
    if ( p->vTables == NULL || Vec_PtrSize(p->vTables) == 0 )
        return;
    // map tables into their nodes
    vNodes = Vec_IntStart( Vec_PtrSize(p->vTables) );
    Wln_NtkForEachObj( p, iObj )
        if ( Wln_ObjType(p, iObj) == ABC_OPER_TABLE )
            Vec_IntWriteEntry( vNodes, Wln_ObjFanin1(p, iObj), iObj );
    // write tables
    Vec_PtrForEachEntry( word *, p->vTables, pTable, i )
    {
        int iNode  = Vec_IntEntry( vNodes, i );
        int iFanin = Wln_ObjFanin0( p, iNode );
        Wln_WriteTableOne( pFile, Wln_ObjRange(p, iFanin), Wln_ObjRange(p, iNode), pTable, i );
    }
    Vec_IntFree( vNodes );
}